

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::BlockEventListControl::Event>::
emplaceRealloc<slang::ast::BlockEventListControl::Event>
          (SmallVectorBase<slang::ast::BlockEventListControl::Event> *this,pointer pos,Event *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  pointer pEVar6;
  bool bVar7;
  undefined7 uVar8;
  pointer pEVar9;
  pointer pEVar10;
  long lVar11;
  long lVar12;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pEVar9 = (pointer)detail::allocArray(capacity,0x10);
  uVar5 = *(undefined8 *)&args->isBegin;
  *(undefined8 *)((long)pEVar9 + lVar12) = args->target;
  ((undefined8 *)((long)pEVar9 + lVar12))[1] = uVar5;
  pEVar10 = this->data_;
  sVar3 = this->len;
  pEVar6 = pEVar9;
  if (pEVar10 + sVar3 == pos) {
    if (sVar3 != 0) {
      lVar11 = 0;
      do {
        puVar4 = (undefined8 *)((long)&pEVar10->target + lVar11);
        uVar5 = puVar4[1];
        puVar1 = (undefined8 *)((long)&pEVar9->target + lVar11);
        *puVar1 = *puVar4;
        puVar1[1] = uVar5;
        lVar11 = lVar11 + 0x10;
      } while (sVar3 * 0x10 != lVar11);
    }
  }
  else {
    for (; pEVar10 != pos; pEVar10 = pEVar10 + 1) {
      bVar7 = pEVar10->isBegin;
      uVar8 = *(undefined7 *)&pEVar10->field_0x9;
      pEVar6->target = pEVar10->target;
      pEVar6->isBegin = bVar7;
      *(undefined7 *)&pEVar6->field_0x9 = uVar8;
      pEVar6 = pEVar6 + 1;
    }
    sVar3 = this->len;
    pEVar10 = this->data_;
    if (pEVar10 + sVar3 != pos) {
      puVar4 = (undefined8 *)((long)pEVar9 + lVar12);
      do {
        uVar5 = *(undefined8 *)&pos->isBegin;
        puVar4[2] = pos->target;
        puVar4[3] = uVar5;
        pos = pos + 1;
        puVar4 = puVar4 + 2;
      } while (pos != pEVar10 + sVar3);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pEVar9;
  return (pointer)((long)pEVar9 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}